

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::CallExpression::evalImpl(CallExpression *this,EvalContext *context)

{
  SourceRange range;
  LookupLocation lookupLocation;
  bool bVar1;
  ER EVar2;
  Expression *pEVar3;
  SystemSubroutine *pSVar4;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar5;
  reference ppEVar6;
  SourceLocation SVar7;
  reference ppFVar8;
  ConstantValue *this_00;
  EvalContext *in_RDX;
  __extent_storage<18446744073709551615UL> _Var9;
  SubroutineSymbol *in_RSI;
  ConstantValue *in_RDI;
  ArgList AVar10;
  SourceRange SVar11;
  ConstantValue result;
  ER er;
  size_t i;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> formals;
  ConstantValue v;
  Expression *arg;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  SmallVector<slang::ConstantValue,_4UL> args;
  SubroutineSymbol *symbol;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *callInfo;
  ConstantValue cv;
  EvalContext *in_stack_fffffffffffffcb8;
  EvalContext *in_stack_fffffffffffffcc0;
  SmallVectorBase<slang::ConstantValue> *in_stack_fffffffffffffcc8;
  SourceLocation in_stack_fffffffffffffcd0;
  SourceLocation in_stack_fffffffffffffcd8;
  ConstantValue *in_stack_fffffffffffffcf0;
  EvalContext *pEVar12;
  ValueSymbol *in_stack_fffffffffffffcf8;
  ValueSymbol *symbol_00;
  EvalContext *in_stack_fffffffffffffd00;
  EvalContext *in_stack_fffffffffffffd08;
  SourceLocation in_stack_fffffffffffffd10;
  SourceLocation SVar13;
  DiagCode code;
  pointer local_2d8;
  EvalContext *this_01;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  SubroutineSymbol *in_stack_fffffffffffffdd0;
  EvalContext *in_stack_fffffffffffffdd8;
  SourceRange in_stack_fffffffffffffde0;
  SourceLocation local_1e0;
  ArgList local_1d8;
  Type *local_1c8;
  anon_union_8_2_f12d5f64_for_typeOrLink aStack_1c0;
  SourceLocation local_1b0;
  uint local_1a4;
  Expression *local_178;
  Expression **local_170;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_168;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_160;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_150;
  SmallVectorBase<slang::ConstantValue> local_148 [2];
  SourceLocation local_90;
  SourceLocation local_88;
  EvalContext *local_80;
  SourceLocation local_78;
  SourceLocation local_70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_68;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *local_58;
  EvalContext *local_18;
  
  local_18 = in_RDX;
  pEVar3 = thisClass((CallExpression *)in_RSI);
  if (pEVar3 == (Expression *)0x0) {
    bVar1 = isSystemCall((CallExpression *)0x9e42be);
    if (bVar1) {
      local_58 = std::
                 get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)0x9e42d8);
      pSVar4 = not_null<const_slang::ast::SystemSubroutine_*>::operator->
                         ((not_null<const_slang::ast::SystemSubroutine_*> *)0x9e42ed);
      local_68 = arguments((CallExpression *)0x9e4312);
      local_78 = ((SourceRange *)&(in_RSI->super_Symbol).parentScope)->startLoc;
      local_70 = *(SourceLocation *)&(in_RSI->super_Symbol).nextInScope;
      (*pSVar4->_vptr_SystemSubroutine[8])
                (in_RDI,pSVar4,local_18,&local_68,local_78,local_70,local_58);
    }
    else {
      ppSVar5 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)0x9e43a0);
      local_80 = (EvalContext *)*ppSVar5;
      local_90 = ((SourceRange *)&(in_RSI->super_Symbol).parentScope)->startLoc;
      local_88 = *(SourceLocation *)&(in_RSI->super_Symbol).nextInScope;
      bVar1 = checkConstant(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffde0);
      if (bVar1) {
        SmallVector<slang::ConstantValue,_4UL>::SmallVector
                  ((SmallVector<slang::ConstantValue,_4UL> *)0x9e441a);
        local_160 = arguments((CallExpression *)0x9e4427);
        _Var9 = local_160._M_extent._M_extent_value;
        local_150 = &local_160;
        local_168._M_current =
             (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_fffffffffffffcb8);
        local_170 = (Expression **)
                    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                               in_stack_fffffffffffffcc8);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffffcc0,
                             (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                              *)in_stack_fffffffffffffcb8);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          ppEVar6 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    ::operator*(&local_168);
          local_178 = *ppEVar6;
          Expression::eval((Expression *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
          bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9e44f7);
          in_stack_fffffffffffffd57 = bVar1;
          if (bVar1) {
            SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
                      (in_stack_fffffffffffffcc8,(ConstantValue *)in_stack_fffffffffffffcc0);
          }
          else {
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          }
          local_1a4 = (uint)!bVar1;
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x9e459b);
          if (local_1a4 != 0) goto LAB_009e49b4;
          __gnu_cxx::
          __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
          ::operator++(&local_168);
        }
        pEVar12 = local_18;
        this_01 = local_80;
        local_1b0 = SourceRange::start((SourceRange *)&(in_RSI->super_Symbol).parentScope);
        local_1c8 = (in_RSI->declaredReturnType).type;
        aStack_1c0 = (in_RSI->declaredReturnType).typeOrLink;
        lookupLocation._8_7_ = in_stack_fffffffffffffd50;
        lookupLocation.scope = (Scope *)local_1b0;
        lookupLocation._15_1_ = in_stack_fffffffffffffd57;
        bVar1 = EvalContext::pushFrame
                          (this_01,(SubroutineSymbol *)pEVar12,(SourceLocation)_Var9._M_extent_value
                           ,lookupLocation);
        if (bVar1) {
          AVar10 = SubroutineSymbol::getArguments((SubroutineSymbol *)in_stack_fffffffffffffcb8);
          local_1e0 = (SourceLocation)0x0;
          local_1d8 = AVar10;
          while( true ) {
            _Var9 = AVar10._M_extent._M_extent_value;
            local_2d8 = AVar10._M_ptr;
            SVar13 = local_1e0;
            SVar7 = (SourceLocation)
                    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                    ::size((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                            *)0x9e46db);
            if ((ulong)SVar7 <= (ulong)SVar13) break;
            in_stack_fffffffffffffd00 = local_18;
            ppFVar8 = std::
                      span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
                      operator[](&local_1d8,(size_type)local_1e0);
            in_stack_fffffffffffffd08 = (EvalContext *)*ppFVar8;
            in_stack_fffffffffffffd10 =
                 (SourceLocation)
                 SmallVectorBase<slang::ConstantValue>::operator[](local_148,(size_type)local_1e0);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffffcc0,
                       (ConstantValue *)in_stack_fffffffffffffcb8);
            EvalContext::createLocal
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
                      );
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x9e476c);
            AVar10._M_extent._M_extent_value = _Var9._M_extent_value;
            AVar10._M_ptr = local_2d8;
            local_1e0 = (SourceLocation)((long)local_1e0 + 1);
          }
          symbol_00 = *(ValueSymbol **)((local_80->stack).stackBase + 0x18);
          pEVar12 = local_18;
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          code = SUB84(_Var9._M_extent_value >> 0x20,0);
          EvalContext::createLocal(in_stack_fffffffffffffd00,symbol_00,(ConstantValue *)pEVar12);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x9e480b);
          SubroutineSymbol::getBody(in_RSI);
          EVar2 = Statement::eval((Statement *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          SVar11.endLoc = in_stack_fffffffffffffcd0;
          SVar11.startLoc = in_stack_fffffffffffffcd8;
          if (EVar2 == Disable) {
            SVar11 = EvalContext::getDisableRange(local_18);
            range.endLoc = SVar13;
            range.startLoc = in_stack_fffffffffffffd10;
            EvalContext::addDiag(in_stack_fffffffffffffd08,code,range);
          }
          this_00 = EvalContext::findLocal
                              ((EvalContext *)SVar11.startLoc,(ValueSymbol *)SVar11.endLoc);
          slang::ConstantValue::ConstantValue(this_00,(ConstantValue *)in_stack_fffffffffffffcb8);
          EvalContext::popFrame((EvalContext *)0x9e4928);
          if ((EVar2 == Fail) || (EVar2 == Disable)) {
            slang::ConstantValue::ConstantValue(this_00,in_stack_fffffffffffffcb8);
          }
          else {
            slang::ConstantValue::ConstantValue(this_00,(ConstantValue *)in_stack_fffffffffffffcb8);
          }
          local_1a4 = 1;
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x9e49b4);
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          local_1a4 = 1;
        }
LAB_009e49b4:
        SmallVector<slang::ConstantValue,_4UL>::~SmallVector
                  ((SmallVector<slang::ConstantValue,_4UL> *)0x9e49c1);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      }
    }
  }
  else {
    thisClass((CallExpression *)in_RSI);
    Expression::eval((Expression *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x9e4286);
  }
  return in_RDI;
}

Assistant:

ConstantValue CallExpression::evalImpl(EvalContext& context) const {
    // If thisClass() is set call eval on it to be sure an error is issued.
    if (thisClass()) {
        auto cv = thisClass()->eval(context);
        SLANG_ASSERT(!cv);
        return nullptr;
    }

    // Delegate system calls to their appropriate handler.
    if (isSystemCall()) {
        auto& callInfo = std::get<1>(subroutine);
        return callInfo.subroutine->eval(context, arguments(), sourceRange, callInfo);
    }

    const SubroutineSymbol& symbol = *std::get<0>(subroutine);
    if (!checkConstant(context, symbol, sourceRange))
        return nullptr;

    // Evaluate all argument in the current stack frame.
    SmallVector<ConstantValue, 4> args;
    for (auto arg : arguments()) {
        ConstantValue v = arg->eval(context);
        if (!v)
            return nullptr;
        args.emplace_back(std::move(v));
    }

    // Push a new stack frame, push argument values as locals.
    if (!context.pushFrame(symbol, sourceRange.start(), lookupLocation))
        return nullptr;

    std::span<const FormalArgumentSymbol* const> formals = symbol.getArguments();
    for (size_t i = 0; i < formals.size(); i++)
        context.createLocal(formals[i], args[i]);

    SLANG_ASSERT(symbol.returnValVar);
    context.createLocal(symbol.returnValVar);

    using ER = Statement::EvalResult;
    ER er = symbol.getBody().eval(context);

    // If we got a disable result, it means a disable statement was evaluated that
    // targeted a block that wasn't executing. This isn't allowed in a constant expression.
    // Handle this before popping the frame so that we get the stack reported.
    if (er == ER::Disable)
        context.addDiag(diag::ConstEvalDisableTarget, context.getDisableRange());

    ConstantValue result = std::move(*context.findLocal(symbol.returnValVar));
    context.popFrame();

    if (er == ER::Fail || er == ER::Disable)
        return nullptr;

    SLANG_ASSERT(er == ER::Success || er == ER::Return);
    return result;
}